

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  int iVar10;
  BeagleCPUImpl<double,_1,_0> *pBVar11;
  ulong uVar12;
  long lVar13;
  pointer pdVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int j;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vector<double,_std::allocator<double>_> tmp;
  allocator_type local_89;
  double *local_88;
  double local_80;
  BeagleCPUImpl<double,_1,_0> *local_78;
  long local_70;
  double *local_68;
  double *local_60;
  int *local_58;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> local_48;
  undefined1 auVar32 [64];
  
  if (0 < this->kPatternCount) {
    lVar19 = 0;
    lVar15 = 0;
    local_88 = preOrderPartial;
    local_80 = edgeLength;
    local_78 = this;
    local_68 = categoryRates;
    local_60 = categoryWeights;
    local_58 = tipStates;
    do {
      local_50 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,(ulong)(uint)(this->kStateCount * this->kStateCount),&local_50,&local_89)
      ;
      pBVar11 = local_78;
      lVar13 = (long)local_58[lVar15];
      uVar8 = this->kStateCount;
      uVar12 = (ulong)uVar8;
      if (local_58[lVar15] < (int)uVar8) {
        iVar9 = this->kCategoryCount;
        if ((long)iVar9 < 1) {
          dVar25 = 0.0;
        }
        else {
          iVar10 = this->kPatternCount;
          lVar16 = (long)this->kPartialsPaddedStateCount;
          pdVar17 = (double *)(lVar19 * lVar16 + (long)local_88);
          auVar23 = ZEXT816(0);
          lVar18 = 0;
          do {
            dVar1 = local_60[lVar18];
            auVar26._8_8_ = 0;
            auVar26._0_8_ = dVar1;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_88[lVar13 + (lVar18 * iVar10 + lVar15) * lVar16];
            auVar23 = vfmadd231sd_fma(auVar23,auVar26,auVar3);
            dVar25 = auVar23._0_8_;
            if (0 < (int)uVar8) {
              dVar2 = local_68[lVar18];
              uVar21 = 0;
              pdVar14 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar13;
              do {
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *pdVar14;
                auVar30._8_8_ = 0;
                auVar30._0_8_ = local_80 * dVar2;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = dVar1 * pdVar17[uVar21];
                auVar31 = vfmadd213sd_fma(auVar33,auVar30,auVar4);
                *pdVar14 = auVar31._0_8_;
                uVar21 = uVar21 + 1;
                pdVar14 = pdVar14 + (int)uVar8;
              } while (uVar12 != uVar21);
            }
            lVar18 = lVar18 + 1;
            pdVar17 = pdVar17 + iVar10 * lVar16;
          } while (lVar18 != iVar9);
        }
        if (0 < (int)uVar8) {
          auVar24._0_8_ = local_78->gPatternWeights[lVar15] / dVar25;
          auVar24._8_8_ = 0;
          lVar13 = lVar13 << 3;
          lVar16 = uVar12 * 8;
          do {
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 *(ulong *)((long)local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar13);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((long)outCrossProducts + lVar13);
            auVar23 = vfmadd213sd_fma(auVar28,auVar24,auVar6);
            *(long *)((long)outCrossProducts + lVar13) = auVar23._0_8_;
            lVar13 = lVar13 + lVar16;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      else {
        iVar9 = this->kCategoryCount;
        if ((long)iVar9 < 1) {
          dVar25 = 0.0;
        }
        else {
          iVar10 = this->kPatternCount;
          lVar13 = (long)this->kPartialsPaddedStateCount;
          pdVar17 = (double *)(lVar19 * lVar13 + (long)local_88);
          auVar23 = ZEXT816(0);
          lVar16 = 0;
          do {
            auVar32 = ZEXT864(0) << 0x40;
            auVar31 = auVar32._0_16_;
            if (0 < (int)uVar8) {
              uVar21 = 0;
              do {
                dVar25 = auVar32._0_8_ + pdVar17[uVar21];
                auVar32 = ZEXT864((ulong)dVar25);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = dVar25;
                uVar21 = uVar21 + 1;
              } while (uVar12 != uVar21);
            }
            dVar25 = local_60[lVar16];
            auVar27._8_8_ = 0;
            auVar27._0_8_ = dVar25;
            if (0 < (int)uVar8) {
              dVar1 = local_68[lVar16];
              uVar21 = 0;
              uVar20 = 0;
              do {
                uVar22 = 0;
                do {
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_48.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar21 + uVar22];
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = local_80 * dVar1;
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = dVar25 * local_88[(lVar16 * iVar10 + lVar15) * lVar13 + uVar20];
                  auVar5 = vfmadd213sd_fma(auVar35,auVar34,auVar5);
                  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21 + uVar22] = auVar5._0_8_;
                  uVar22 = uVar22 + 1;
                } while (uVar12 != uVar22);
                uVar20 = uVar20 + 1;
                uVar21 = (ulong)((int)uVar21 + uVar8);
              } while (uVar20 != uVar12);
            }
            auVar23 = vfmadd213sd_fma(auVar27,auVar31,auVar23);
            dVar25 = auVar23._0_8_;
            lVar16 = lVar16 + 1;
            pdVar17 = pdVar17 + iVar10 * lVar13;
          } while (lVar16 != iVar9);
        }
        if (0 < (int)uVar8) {
          auVar23._0_8_ = local_78->gPatternWeights[lVar15] / dVar25;
          auVar23._8_8_ = 0;
          uVar21 = 0;
          pdVar14 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar17 = outCrossProducts;
          do {
            uVar20 = 0;
            do {
              auVar29._8_8_ = 0;
              auVar29._0_8_ = pdVar14[uVar20];
              auVar7._8_8_ = 0;
              auVar7._0_8_ = pdVar17[uVar20];
              auVar31 = vfmadd213sd_fma(auVar29,auVar23,auVar7);
              pdVar17[uVar20] = auVar31._0_8_;
              uVar20 = uVar20 + 1;
            } while (uVar12 != uVar20);
            uVar21 = uVar21 + 1;
            pdVar17 = pdVar17 + uVar12;
            pdVar14 = pdVar14 + uVar12;
          } while (uVar21 != uVar12);
        }
      }
      local_70 = lVar19;
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar15 = lVar15 + 1;
      lVar19 = lVar19 + 8;
      this = pBVar11;
    } while (lVar15 < pBVar11->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}